

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::PluralFormat::toPattern(PluralFormat *this,UnicodeString *appendTo)

{
  int32_t iVar1;
  UnicodeString *srcText;
  UnicodeString *appendTo_local;
  PluralFormat *this_local;
  
  iVar1 = MessagePattern::countParts(&this->msgPattern);
  if (iVar1 == 0) {
    icu_63::UnicodeString::setToBogus(appendTo);
  }
  else {
    srcText = MessagePattern::getPatternString(&this->msgPattern);
    icu_63::UnicodeString::append(appendTo,srcText);
  }
  return appendTo;
}

Assistant:

UnicodeString&
PluralFormat::toPattern(UnicodeString& appendTo) {
    if (0 == msgPattern.countParts()) {
        appendTo.setToBogus();
    } else {
        appendTo.append(msgPattern.getPatternString());
    }
    return appendTo;
}